

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex.cc
# Opt level: O3

RatioTestResult * __thiscall
fizplex::Simplex::run_ratio_test
          (RatioTestResult *__return_storage_ptr__,Simplex *this,Candidate candidate,Base *base)

{
  vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_> *__x;
  RatioTester local_49;
  vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_> local_48;
  
  if (candidate.is_optimal == true) {
    __return_storage_ptr__->step_length = 0.0;
    __return_storage_ptr__->leaving_bound = 0.0;
    *(undefined8 *)__return_storage_ptr__ = 0;
    __return_storage_ptr__->leaving_index = 0;
  }
  else {
    __x = &ColMatrix::column(&this->lp->A,candidate.index)->values;
    std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>::vector
              (&local_48,__x);
    Base::ftran(base,(SVector *)&local_48);
    RatioTester::ratio_test
              (__return_storage_ptr__,&local_49,this->lp,(SVector *)&local_48,&this->x,
               candidate.index,&this->basic_indices,candidate.cost);
    if (local_48.
        super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.
                      super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.
                            super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.
                            super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Simplex::RatioTestResult Simplex::run_ratio_test(Simplex::Candidate candidate,
                                                 Base &base) const {
  // Can skip expensive calculation as it won't be used when optimal
  if (candidate.is_optimal)
    return Simplex::RatioTestResult();

  SVector alpha = lp.A.column(candidate.index);
  base.ftran(alpha);
  return RatioTester().ratio_test(lp, alpha, x, candidate.index, basic_indices,
                                  candidate.cost);
}